

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateCompanionObject
          (KotlinKMPGenerator *this,CodeWriter *code,function<void_()> *callback)

{
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"companion object {",&local_51);
  CodeWriter::operator+=(code,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  code->cur_ident_lvl_ = code->cur_ident_lvl_ + 1;
  std::function<void_()>::operator()(callback);
  if (code->cur_ident_lvl_ != 0) {
    code->cur_ident_lvl_ = code->cur_ident_lvl_ + -1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"}",&local_51);
  CodeWriter::operator+=(code,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void GenerateCompanionObject(CodeWriter &code,
                               const std::function<void()> &callback) const {
    code += "companion object {";
    code.IncrementIdentLevel();
    callback();
    code.DecrementIdentLevel();
    code += "}";
  }